

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O2

TestCaseResultPtr __thiscall xe::BatchResult::createTestCaseResult(BatchResult *this,char *casePath)

{
  long lVar1;
  long lVar2;
  mapped_type *pmVar3;
  TestCaseResultData *this_00;
  char *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  TestCaseResultPtr TVar4;
  allocator<char> local_49;
  key_type local_48;
  
  std::
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  ::reserve((vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
             *)(casePath + 0xe0),(*(long *)(casePath + 0xe8) - *(long *)(casePath + 0xe0) >> 4) + 1)
  ;
  lVar1 = *(long *)(casePath + 0xe8);
  lVar2 = *(long *)(casePath + 0xe0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,in_RDX,&local_49);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)(casePath + 0xf8),&local_48);
  *pmVar3 = (mapped_type)((ulong)(lVar1 - lVar2) >> 4);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (TestCaseResultData *)operator_new(0x60);
  TestCaseResultData::TestCaseResultData(this_00,in_RDX);
  de::SharedPtr<xe::TestCaseResultData>::SharedPtr
            ((SharedPtr<xe::TestCaseResultData> *)this,this_00);
  std::
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  ::push_back((vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
               *)(casePath + 0xe0),(value_type *)this);
  TVar4.m_state = extraout_RDX;
  TVar4.m_ptr = (TestCaseResultData *)this;
  return TVar4;
}

Assistant:

TestCaseResultPtr BatchResult::createTestCaseResult (const char* casePath)
{
	DE_ASSERT(!hasTestCaseResult(casePath));

	m_testCaseResults.reserve(m_testCaseResults.size()+1);
	m_resultMap[casePath] = (int)m_testCaseResults.size();

	TestCaseResultPtr caseResult(new TestCaseResultData(casePath));
	m_testCaseResults.push_back(caseResult);

	return caseResult;
}